

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::CustomLayerParams_CustomLayerParamValue::SerializeWithCachedSizes
          (CustomLayerParams_CustomLayerParamValue *this,CodedOutputStream *output)

{
  bool bVar1;
  int size;
  int32 value;
  char *data;
  string *value_00;
  int64 value_01;
  double value_02;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  CustomLayerParams_CustomLayerParamValue *this_local;
  
  bVar1 = has_doublevalue(this);
  if (bVar1) {
    value_02 = doublevalue(this);
    google::protobuf::internal::WireFormatLite::WriteDouble(10,value_02,output);
  }
  bVar1 = has_stringvalue(this);
  if (bVar1) {
    stringvalue_abi_cxx11_(this);
    data = (char *)std::__cxx11::string::data();
    stringvalue_abi_cxx11_(this);
    size = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (data,size,SERIALIZE,
               "CoreML.Specification.CustomLayerParams.CustomLayerParamValue.stringValue");
    value_00 = stringvalue_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(0x14,value_00,output);
  }
  bVar1 = has_intvalue(this);
  if (bVar1) {
    value = intvalue(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(0x1e,value,output);
  }
  bVar1 = has_longvalue(this);
  if (bVar1) {
    value_01 = longvalue(this);
    google::protobuf::internal::WireFormatLite::WriteInt64(0x28,value_01,output);
  }
  bVar1 = has_boolvalue(this);
  if (bVar1) {
    bVar1 = boolvalue(this);
    google::protobuf::internal::WireFormatLite::WriteBool(0x32,bVar1,output);
  }
  return;
}

Assistant:

void CustomLayerParams_CustomLayerParamValue::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.CustomLayerParams.CustomLayerParamValue)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // double doubleValue = 10;
  if (has_doublevalue()) {
    ::google::protobuf::internal::WireFormatLite::WriteDouble(10, this->doublevalue(), output);
  }

  // string stringValue = 20;
  if (has_stringvalue()) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->stringvalue().data(), this->stringvalue().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.CustomLayerParams.CustomLayerParamValue.stringValue");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      20, this->stringvalue(), output);
  }

  // int32 intValue = 30;
  if (has_intvalue()) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(30, this->intvalue(), output);
  }

  // int64 longValue = 40;
  if (has_longvalue()) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(40, this->longvalue(), output);
  }

  // bool boolValue = 50;
  if (has_boolvalue()) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(50, this->boolvalue(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.CustomLayerParams.CustomLayerParamValue)
}